

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_vertexbuffer.cpp
# Opt level: O2

void __thiscall FFlatVertexBuffer::CheckUpdate(FFlatVertexBuffer *this,sector_t *sector)

{
  sector_t *sector_00;
  uint i;
  ulong uVar1;
  
  CheckPlanes(this,sector);
  sector_00 = sector_t::GetHeightSec(sector);
  if (sector_00 != (sector_t *)0x0) {
    CheckPlanes(this,sector_00);
  }
  for (uVar1 = 0; uVar1 < (sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      uVar1 = uVar1 + 1) {
    CheckPlanes(this,(sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar1]->
                     model);
  }
  return;
}

Assistant:

void FFlatVertexBuffer::CheckUpdate(sector_t *sector)
{
	CheckPlanes(sector);
	sector_t *hs = sector->GetHeightSec();
	if (hs != NULL) CheckPlanes(hs);
	for (unsigned i = 0; i < sector->e->XFloor.ffloors.Size(); i++)
		CheckPlanes(sector->e->XFloor.ffloors[i]->model);
}